

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<long,_double>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<long,_double>_>
                 *this,char *ptr,ParseContext *ctx)

{
  long *out;
  size_type sVar1;
  ValueOnMemory *pVVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  bool bVar10;
  MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
  *pMVar11;
  char *local_50;
  pair<google::protobuf::Map<long,_double>::InnerMap::iterator_base<google::protobuf::MapPair<long,_double>_>,_bool>
  local_48;
  
  local_50 = ptr;
  bVar10 = EpsCopyInputStream::DoneWithCheck
                     (&ctx->super_EpsCopyInputStream,&local_50,ctx->group_depth_);
  if (bVar10) {
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else if (*local_50 == '\b') {
    out = &this->key_;
    local_50 = VarintParse<unsigned_long>(local_50 + 1,(unsigned_long *)out);
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
    bVar10 = EpsCopyInputStream::DoneWithCheck
                       (&ctx->super_EpsCopyInputStream,&local_50,ctx->group_depth_);
    if (bVar10) {
      if (local_50 == (char *)0x0) {
        return (char *)0x0;
      }
LAB_00134493:
      pMVar11 = (MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
                 *)Arena::
                   CreateMaybeMessage<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse>
                             ((this->mf_->map_).elements_.alloc_.arena_);
      this->entry_ = pMVar11;
    }
    else {
      if (*local_50 != '\x11') goto LAB_00134493;
      sVar1 = (this->map_->elements_).num_elements_;
      Map<long,double>::InnerMap::insert<long_const&>(&local_48,this->map_,out);
      this->value_ptr_ = (double *)&(local_48.first.node_)->field_0x8;
      if (sVar1 == (this->map_->elements_).num_elements_) goto LAB_00134493;
      cVar3 = local_50[2];
      cVar4 = local_50[3];
      cVar5 = local_50[4];
      cVar6 = local_50[5];
      cVar7 = local_50[6];
      cVar8 = local_50[7];
      cVar9 = local_50[8];
      (local_48.first.node_)->field_0x8 = local_50[1];
      (local_48.first.node_)->field_0x9 = cVar3;
      (local_48.first.node_)->field_0xa = cVar4;
      (local_48.first.node_)->field_0xb = cVar5;
      (local_48.first.node_)->field_0xc = cVar6;
      (local_48.first.node_)->field_0xd = cVar7;
      (local_48.first.node_)->field_0xe = cVar8;
      (local_48.first.node_)->field_0xf = cVar9;
      local_50 = local_50 + 9;
      bVar10 = EpsCopyInputStream::DoneWithCheck
                         (&ctx->super_EpsCopyInputStream,&local_50,ctx->group_depth_);
      if (bVar10) {
        return local_50;
      }
      if (local_50 == (char *)0x0) {
        return (char *)0x0;
      }
      pMVar11 = (MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
                 *)Arena::
                   CreateMaybeMessage<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse>
                             ((this->mf_->map_).elements_.alloc_.arena_);
      this->entry_ = pMVar11;
      pVVar2 = this->value_ptr_;
      pMVar11->_has_bits_[0] = pMVar11->_has_bits_[0] | 2;
      pMVar11->value_ = *pVVar2;
      Map<long,_double>::erase<long>(this->map_,out);
      pMVar11 = this->entry_;
    }
    *(byte *)pMVar11->_has_bits_ = (byte)pMVar11->_has_bits_[0] | 1;
    pMVar11->key_ = *out;
    goto LAB_001344b1;
  }
  pMVar11 = (MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
             *)Arena::CreateMaybeMessage<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse>
                         ((this->mf_->map_).elements_.alloc_.arena_);
  this->entry_ = pMVar11;
LAB_001344b1:
  local_50 = MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
             ::_InternalParse(pMVar11,local_50,ctx);
  if (local_50 == (char *)0x0) {
    return (char *)0x0;
  }
  UseKeyAndValueFromEntry(this);
  return local_50;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }